

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::Attribute
          (FormattingScene *this,string *target,ParsedParameterVector *params,FileLoc loc)

{
  size_t sVar1;
  ostream *poVar2;
  RGBColorSpace *in_RDX;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  ParameterDictionary dict;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffe70;
  polymorphic_allocator<pbrt::ParsedParameter_*> *in_stack_fffffffffffffe80;
  FormattingScene *this_00;
  ParameterDictionary *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  string local_138 [28];
  int in_stack_fffffffffffffee4;
  ParameterDictionary *in_stack_fffffffffffffee8;
  undefined1 local_e8 [232];
  
  this_00 = (FormattingScene *)local_e8;
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            (&in_stack_fffffffffffffe70->alloc);
  this_01 = (ParameterDictionary *)(local_e8 + 8);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)in_RDX,in_RDI,in_stack_fffffffffffffe80);
  ParameterDictionary::ParameterDictionary(this_01,(ParsedParameterVector *)this_00,in_RDX);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(in_stack_fffffffffffffe70);
  indent_abi_cxx11_(this_00,(int)((ulong)in_RDX >> 0x20));
  Printf<std::__cxx11::string,std::__cxx11::string_const&>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  sVar1 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
          ::size((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  *)in_RDX);
  if (sVar1 == 1) {
    ParameterDictionary::ToParameterList_abi_cxx11_
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
    poVar2 = std::operator<<((ostream *)&std::cout,local_138);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string(local_138);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,'\n');
    ParameterDictionary::ToParameterList_abi_cxx11_
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
    std::operator<<(poVar2,(string *)&stack0xfffffffffffffea8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
  }
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x68198f);
  return;
}

Assistant:

void FormattingScene::Attribute(const std::string &target, ParsedParameterVector params,
                                FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    Printf("%sAttribute \"%s\" ", indent(), target);
    if (params.size() == 1)
        // just one; put it on the same line
        std::cout << dict.ToParameterList(0) << '\n';
    else
        std::cout << '\n' << dict.ToParameterList(catIndentCount);
}